

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::BufferStorage::MapPersistentDrawTest::iterate(MapPersistentDrawTest *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  GLvoid *pGVar3;
  GLvoid *pGVar4;
  bool bVar5;
  int iVar6;
  ContextType ctxType;
  GLenum GVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  ConstPixelBufferAccess *pCVar9;
  void *__buf;
  void *__buf_00;
  qpTestResult testResult;
  char *pcVar10;
  MoveMapOwner MVar11;
  MoveMapOwner MVar12;
  allocator<char> local_752;
  allocator<char> local_751;
  MapPersistentDrawTest *local_750;
  undefined4 local_748;
  allocator<char> local_743;
  allocator<char> local_742;
  allocator<char> local_741;
  string local_740;
  string local_720;
  Framebuffer framebuffer;
  Buffer rectangles;
  MapOwner atom_map;
  Texture texture;
  MapOwner rectangles_map;
  VertexArray vao;
  Buffer atom;
  ConstPixelBufferAccess img;
  Program program;
  GLint clear_color [4];
  undefined1 local_5b8 [384];
  GLubyte texture_data [1024];
  Functions *gl;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar6);
  rectangles.m_context = (this->super_TestCase).m_context;
  atom.m_id = 0xffffffff;
  rectangles.m_id = 0xffffffff;
  atom.m_target = 0x8892;
  rectangles.m_target = 0x8892;
  local_750 = this;
  atom.m_context = rectangles.m_context;
  BufferStorage::Buffer::InitStorage(&atom,0x92c0,0x43,4,(GLvoid *)0x0);
  BufferStorage::Buffer::InitStorage(&rectangles,0x8a11,0x42,0x20,(GLvoid *)0x0);
  framebuffer.m_context = (local_750->super_TestCase).m_context;
  framebuffer.m_id = 0xffffffff;
  texture.m_id = 0xffffffff;
  texture.m_context = framebuffer.m_context;
  BufferStorage::Texture::Generate(gl,&texture.m_id);
  BufferStorage::Texture::Bind(gl,texture.m_id,0xde1);
  BufferStorage::Texture::Storage(gl,0xde1,1,0x8058,0x10,0x10,0);
  BufferStorage::Framebuffer::Generate(gl,&framebuffer.m_id);
  BufferStorage::Framebuffer::Bind(gl,0x8ca9,framebuffer.m_id);
  BufferStorage::Framebuffer::AttachTexture(gl,0x8ca9,0x8ce0,texture.m_id,0x10,0x10);
  vao.m_context = (local_750->super_TestCase).m_context;
  vao.m_id = 0xffffffff;
  VertexArray::Generate(gl,&vao.m_id);
  VertexArray::Bind(gl,vao.m_id);
  program.m_compute.m_context = (local_750->super_TestCase).m_context;
  program.m_id = 0;
  program.m_compute.m_id = 0;
  program.m_fragment.m_id = 0;
  program.m_geometry.m_id = 0;
  program.m_tess_ctrl.m_id = 0;
  program.m_tess_eval.m_id = 0;
  program.m_vertex.m_id = 0;
  program.m_fragment.m_context = program.m_compute.m_context;
  program.m_geometry.m_context = program.m_compute.m_context;
  program.m_tess_ctrl.m_context = program.m_compute.m_context;
  program.m_tess_eval.m_context = program.m_compute.m_context;
  program.m_vertex.m_context = program.m_compute.m_context;
  program.m_context = program.m_compute.m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_5b8,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)clear_color);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&img,
             "#version 440 core\n\nin  float gs_fs_color;\nout vec4  fs_out_color;\n\nvoid main()\n{\n    fs_out_color = vec4(gs_fs_color, 0, 0, 1);\n}\n\n"
             ,&local_751);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,
             "#version 440 core\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nstruct Rectangle {\n    vec2 position;\n    vec2 size;\n};\n\nlayout (std140, binding = 0) uniform Rectangles {\n    Rectangle rectangle[2];\n} rectangles;\n\nlayout (binding = 0) uniform atomic_uint atom_color;\n\nin  uint  vs_gs_index[];\nout float gs_fs_color;\n\nvoid main()\n{\n    const uint  atom_color_value = atomicCounterIncrement(atom_color);\n    //const uint  atom_color_value = vs_gs_index[0];\n    const float color            = float(atom_color_value) / 255.0;\n    //const float color            = rectangles.rectangle[1].size.x;\n\n    const float left   = rectangles.rectangle[vs_gs_index[0]].position.x;\n    const float bottom = rectangles.rectangle[vs_gs_index[0]].position.y;\n    const float right  = rectangles.rectangle[vs_gs_index[0]].size.x + left;\n    const float top    = rectangles.rectangle[vs_gs_index[0]].size.y + bottom;\n\n    //const float left   = rectangles.rectangle[0].position.x;\n    //const float bottom = rectangles.rectangle[0].position.y;\n    //const float right  = rectangles.rectangle[0].size.x + left;\n    //const float top    = rectangles.rectangle[0].size.y + bottom;\n\n    gs_fs_color = color;\n    gl_Position  = vec4(left, bottom, 0, 1);\n    EmitVertex();\n\n    gs_fs_color = color;\n    gl_Position  = vec4(left, top, 0, 1);\n    EmitVertex();\n\n    gs_fs_color = color;\n    gl_Position  = vec4(right, bottom, 0, 1);\n    EmitVertex();\n\n    gs_fs_color = color;\n    gl_Position  = vec4(right, top, 0, 1);\n    EmitVertex();\n}\n\n"
             ,&local_752);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_740,glcts::fixed_sample_locations_values + 1,&local_741);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&atom_map,glcts::fixed_sample_locations_values + 1,&local_742);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rectangles_map,
             "#version 440 core\n\nout uint vs_gs_index;\n\nvoid main()\n{\n    vs_gs_index = gl_VertexID;\n}\n\n"
             ,&local_743);
  BufferStorage::Program::Init
            (&program,(string *)local_5b8,(string *)&img,&local_720,&local_740,(string *)&atom_map,
             (string *)&rectangles_map);
  std::__cxx11::string::~string((string *)&rectangles_map);
  std::__cxx11::string::~string((string *)&atom_map);
  std::__cxx11::string::~string((string *)&local_740);
  std::__cxx11::string::~string((string *)&local_720);
  std::__cxx11::string::~string((string *)&img);
  std::__cxx11::string::~string((string *)local_5b8);
  BufferStorage::Program::Use(gl,program.m_id);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((local_750->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x154);
  BufferStorage::Buffer::Bind(&atom);
  MVar11 = BufferStorage::Buffer::MapRange(&atom,0,4,(uint)bVar5 * 0x10 + 0x43);
  atom_map.m_buffer = MVar11.buffer;
  atom_map.m_data = MVar11.data;
  BufferStorage::Buffer::Bind(&rectangles);
  MVar12 = BufferStorage::Buffer::MapRange(&rectangles,0,0x20,(uint)bVar5 * 0x10 | 0x42);
  rectangles_map.m_data = MVar12.data;
  rectangles_map.m_buffer = MVar12.buffer;
  BufferStorage::Buffer::Bind(gl,0,0x92c0);
  BufferStorage::Buffer::Bind(gl,0,0x8a11);
  BufferStorage::Buffer::BindBase(gl,atom.m_id,0x92c0,0);
  BufferStorage::Buffer::BindBase(gl,rectangles.m_id,0x8a11,0);
  (*gl->enable)(0xbe2);
  (*gl->blendFunc)(1,1);
  pGVar4 = rectangles_map.m_data;
  *(undefined4 *)MVar11.data = 1;
  *(undefined8 *)rectangles_map.m_data = 0xbf000000bf000000;
  *(undefined8 *)((long)rectangles_map.m_data + 8) = 0x3f8000003f800000;
  *(undefined8 *)((long)rectangles_map.m_data + 0x10) = 0xbf400000bf400000;
  *(undefined8 *)((long)rectangles_map.m_data + 0x18) = 0x3fc000003fc00000;
  if (bVar5) {
    (*gl->flushMappedBufferRange)(0x92c0,0,4);
    GVar7 = (*gl->getError)();
    pcVar10 = "glFlushMappedBufferRange";
    glu::checkError(GVar7,"glFlushMappedBufferRange",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0xe01);
    (*gl->flushMappedBufferRange)(0x8a11,0,0x20);
    dVar8 = (*gl->getError)();
    iVar6 = 0xe04;
  }
  else {
    (*gl->memoryBarrier)(0x4000);
    dVar8 = (*gl->getError)();
    iVar6 = 0xe09;
    pcVar10 = "MemoryBarrier";
  }
  glu::checkError(dVar8,pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,iVar6);
  clear_color[0] = 0;
  clear_color[1] = 0;
  clear_color[2] = 0;
  clear_color[3] = 0;
  (*gl->clearBufferiv)(0x1800,0,clear_color);
  (*gl->drawArrays)(0,0,2);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"DrawArrays with persistently mapped buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xe12);
  (*gl->memoryBarrier)(0xffffffff);
  GVar7 = (*gl->getError)();
  pcVar10 = "MemoryBarrier";
  glu::checkError(GVar7,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xe16);
  BufferStorage::Texture::GetData(gl,0xde1,0x1908,0x1401,texture_data);
  local_748 = (undefined4)
              CONCAT71((int7)((ulong)extraout_RAX >> 8),texture_data._540_4_ == -0xfffffd);
  if (texture_data._540_4_ != -0xfffffd) {
    local_5b8._0_8_ = ((local_750->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_5b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Contents of framebuffer does not correspond with expected results");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    local_5b8._0_4_ = RGBA;
    local_5b8._4_4_ = UNORM_INT8;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&img,(TextureFormat *)local_5b8,0x10,0x10,1,texture_data);
    pTVar2 = ((local_750->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_720,"Framebuffer",&local_751);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_740,"Framebuffer contents using initial buffer data",&local_752);
    pCVar9 = &img;
    tcu::LogImage::LogImage
              ((LogImage *)local_5b8,&local_720,&local_740,pCVar9,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_5b8,(int)pTVar2,__buf,(size_t)pCVar9);
    tcu::LogImage::~LogImage((LogImage *)local_5b8);
    std::__cxx11::string::~string((string *)&local_740);
    std::__cxx11::string::~string((string *)&local_720);
  }
  pGVar3 = atom_map.m_data;
  if (*atom_map.m_data != 3) {
    local_5b8._0_8_ = ((local_750->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_5b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Contents of ATOMIC_COUNTER buffer are invalid.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    local_748 = 0;
  }
  *(undefined4 *)pGVar3 = 5;
  *(undefined8 *)pGVar4 = 0xbf800000bf800000;
  *(undefined1 **)((long)pGVar4 + 8) = &DAT_3f0000003f000000;
  *(undefined1 **)((long)pGVar4 + 0x10) = &DAT_3f0000003f000000;
  *(undefined1 **)((long)pGVar4 + 0x18) = &DAT_3f0000003f000000;
  if (bVar5) {
    (*gl->flushMappedBufferRange)(0x92c0,0,4);
    GVar7 = (*gl->getError)();
    pcVar10 = "glFlushMappedBufferRange";
    glu::checkError(GVar7,"glFlushMappedBufferRange",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0xe3a);
    (*gl->flushMappedBufferRange)(0x8a11,0,0x20);
    dVar8 = (*gl->getError)();
    iVar6 = 0xe3d;
  }
  else {
    (*gl->memoryBarrier)(0x4000);
    dVar8 = (*gl->getError)();
    iVar6 = 0xe42;
  }
  glu::checkError(dVar8,pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,iVar6);
  (*gl->drawArrays)(0,0,2);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"DrawArrays with persistently mapped buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xe47);
  (*gl->memoryBarrier)(0xffffffff);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xe4b);
  BufferStorage::Texture::GetData(gl,0xde1,0x1908,0x1401,texture_data);
  if (texture_data._540_4_ != -0xfffffd) {
    local_5b8._0_8_ = ((local_750->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_5b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Contents of framebuffer does not correspond with expected results");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    local_5b8._0_4_ = RGBA;
    local_5b8._4_4_ = UNORM_INT8;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&img,(TextureFormat *)local_5b8,0x10,0x10,1,texture_data);
    pTVar2 = ((local_750->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_720,"Framebuffer",&local_751);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_740,"Framebuffer contents using updated buffer data",&local_752);
    pCVar9 = &img;
    tcu::LogImage::LogImage
              ((LogImage *)local_5b8,&local_720,&local_740,pCVar9,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_5b8,(int)pTVar2,__buf_00,(size_t)pCVar9);
    tcu::LogImage::~LogImage((LogImage *)local_5b8);
    std::__cxx11::string::~string((string *)&local_740);
    std::__cxx11::string::~string((string *)&local_720);
    local_748 = 0;
  }
  if (*pGVar3 == 7) {
    BufferStorage::Buffer::MapOwner::~MapOwner(&rectangles_map);
    BufferStorage::Buffer::MapOwner::~MapOwner(&atom_map);
    if ((char)local_748 != '\0') {
      pcVar10 = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00942c8c;
    }
  }
  else {
    local_5b8._0_8_ = ((local_750->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_5b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Contents of ATOMIC_COUNTER buffer are invalid.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    BufferStorage::Buffer::MapOwner::~MapOwner(&rectangles_map);
    BufferStorage::Buffer::MapOwner::~MapOwner(&atom_map);
  }
  pcVar10 = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00942c8c:
  tcu::TestContext::setTestResult
            (((local_750->super_TestCase).m_context)->m_testCtx,testResult,pcVar10);
  BufferStorage::Program::~Program(&program);
  VertexArray::~VertexArray(&vao);
  BufferStorage::Texture::~Texture(&texture);
  BufferStorage::Framebuffer::~Framebuffer(&framebuffer);
  BufferStorage::Buffer::~Buffer(&rectangles);
  BufferStorage::Buffer::~Buffer(&atom);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MapPersistentDrawTest::iterate()
{
	/*
	 *   * fragment shader should pass value of "gs_fs_color" varying to red
	 *   channel of output color;
	 */
	static const GLchar* fragment_shader = "#version 440 core\n"
										   "\n"
										   "in  float gs_fs_color;\n"
										   "out vec4  fs_out_color;\n"
										   "\n"
										   "void main()\n"
										   "{\n"
										   "    fs_out_color = vec4(gs_fs_color, 0, 0, 1);\n"
										   "}\n"
										   "\n";

	/*
	 *   * geometry shader should:
	 *     - define single uniform buffer array "rectangles" with unspecified size;
	 *     Rectangles should have two vec2 fields: position and size;
	 *     - define single atomic_uint "atom_color";
	 *     - increment "atom_color" once per execution;
	 *     - output a quad that is placed at rectangles[vs_gs_index].position and
	 *     has size equal rectangles[vs_gs_index].size;
	 *     - define output float varying "gs_fs_color" equal to "atom_color" / 255;
	 */
	static const GLchar* geometry_shader =
		"#version 440 core\n"
		"\n"
		"layout(points)                           in;\n"
		"layout(triangle_strip, max_vertices = 4) out;\n"
		"\n"
		"struct Rectangle {\n"
		"    vec2 position;\n"
		"    vec2 size;\n"
		"};\n"
		"\n"
		"layout (std140, binding = 0) uniform Rectangles {\n"
		"    Rectangle rectangle[2];\n"
		"} rectangles;\n"
		"\n"
		"layout (binding = 0) uniform atomic_uint atom_color;\n"
		"\n"
		"in  uint  vs_gs_index[];\n"
		"out float gs_fs_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    const uint  atom_color_value = atomicCounterIncrement(atom_color);\n"
		"    //const uint  atom_color_value = vs_gs_index[0];\n"
		"    const float color            = float(atom_color_value) / 255.0;\n"
		"    //const float color            = rectangles.rectangle[1].size.x;\n"
		"\n"
		"    const float left   = rectangles.rectangle[vs_gs_index[0]].position.x;\n"
		"    const float bottom = rectangles.rectangle[vs_gs_index[0]].position.y;\n"
		"    const float right  = rectangles.rectangle[vs_gs_index[0]].size.x + left;\n"
		"    const float top    = rectangles.rectangle[vs_gs_index[0]].size.y + bottom;\n"
		"\n"
		"    //const float left   = rectangles.rectangle[0].position.x;\n"
		"    //const float bottom = rectangles.rectangle[0].position.y;\n"
		"    //const float right  = rectangles.rectangle[0].size.x + left;\n"
		"    //const float top    = rectangles.rectangle[0].size.y + bottom;\n"
		"\n"
		"    gs_fs_color = color;\n"
		"    gl_Position  = vec4(left, bottom, 0, 1);\n"
		"    EmitVertex();\n"
		"\n"
		"    gs_fs_color = color;\n"
		"    gl_Position  = vec4(left, top, 0, 1);\n"
		"    EmitVertex();\n"
		"\n"
		"    gs_fs_color = color;\n"
		"    gl_Position  = vec4(right, bottom, 0, 1);\n"
		"    EmitVertex();\n"
		"\n"
		"    gs_fs_color = color;\n"
		"    gl_Position  = vec4(right, top, 0, 1);\n"
		"    EmitVertex();\n"
		"}\n"
		"\n";

	/*
	 *   * vertex shader should output single varying "vs_gs_index" of type uint,
	 *   equal to gl_VertexID;
	 */
	static const GLchar* vertex_shader = "#version 440 core\n"
										 "\n"
										 "out uint vs_gs_index;\n"
										 "\n"
										 "void main()\n"
										 "{\n"
										 "    vs_gs_index = gl_VertexID;\n"
										 "}\n"
										 "\n";

	static const GLuint atom_binding		 = 0;
	static const size_t atom_data_size		 = 1 * sizeof(GLuint);
	static const GLuint expected_atom_first  = 3;
	static const GLuint expected_atom_second = 7;
	static const GLuint expected_pixel		 = 0xff000003;
	static const GLuint height				 = 16;
	static const GLuint n_rectangles		 = 2;
	static const GLuint pixel_size			 = 4 * sizeof(GLubyte);
	static const GLuint rectangles_binding   = 0;
	static const size_t rectangle_size		 = 2 * 2 * sizeof(GLfloat); /* 2 * vec2 */
	static const size_t rectangles_data_size = n_rectangles * rectangle_size;
	static const GLuint width				 = 16;
	static const GLuint line_size			 = width * pixel_size;
	static const GLuint pixel_offset		 = 8 * line_size + 7 * pixel_size;
	static const size_t texture_data_size	= height * line_size;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	/* Prepare data */
	GLuint  atom_first_data[1];
	GLuint  atom_second_data[1];
	GLubyte rectangles_first_data[rectangles_data_size];
	GLubyte rectangles_second_data[rectangles_data_size];
	GLubyte texture_data[texture_data_size];

	atom_first_data[0]  = 1;
	atom_second_data[0] = 5;

	{
		GLfloat* ptr = (GLfloat*)rectangles_first_data;

		/* First.position*/
		ptr[0] = -0.5f;
		ptr[1] = -0.5f;

		/* First.size*/
		ptr[2] = 1.0f;
		ptr[3] = 1.0f;

		/* Second.position*/
		ptr[4 + 0] = -0.75f;
		ptr[4 + 1] = -0.75f;

		/* Second.size*/
		ptr[4 + 2] = 1.5f;
		ptr[4 + 3] = 1.5f;
	}

	{
		GLfloat* ptr = (GLfloat*)rectangles_second_data;

		/* First.position*/
		ptr[0] = -1.0f;
		ptr[1] = -1.0f;

		/* First.size*/
		ptr[2] = 0.5f;
		ptr[3] = 0.5f;

		/* Second.position*/
		ptr[4 + 0] = 0.5f;
		ptr[4 + 1] = 0.5f;

		/* Second.size*/
		ptr[4 + 2] = 0.5f;
		ptr[4 + 3] = 0.5f;
	}

	/* Prepare buffers */
	Buffer atom(m_context);
	Buffer rectangles(m_context);

	atom.InitStorage(GL_ATOMIC_COUNTER_BUFFER, GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT,
					 atom_data_size, 0);

	rectangles.InitStorage(GL_UNIFORM_BUFFER, GL_MAP_PERSISTENT_BIT | GL_MAP_WRITE_BIT, rectangles_data_size, 0);

	/* Prepare framebuffer */
	Framebuffer framebuffer(m_context);
	Texture		texture(m_context);

	Texture::Generate(gl, texture.m_id);
	Texture::Bind(gl, texture.m_id, GL_TEXTURE_2D);
	Texture::Storage(gl, GL_TEXTURE_2D, 1 /* levels */, GL_RGBA8, width, height, 0 /* depth */);

	Framebuffer::Generate(gl, framebuffer.m_id);
	Framebuffer::Bind(gl, GL_DRAW_FRAMEBUFFER, framebuffer.m_id);
	Framebuffer::AttachTexture(gl, GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture.m_id, width, height);

	/* Prepare VAO */
	VertexArray vao(m_context);

	VertexArray::Generate(gl, vao.m_id);
	VertexArray::Bind(gl, vao.m_id);

	/* Prepare program */
	Program program(m_context);
	program.Init("" /* cs */, fragment_shader, geometry_shader, "" /* tcs */, "" /* tes */, vertex_shader);
	Program::Use(gl, program.m_id);

	/*
	 * - make persistent mapping of both buffers for reads and writes;
	 * - modify "rectangles" buffer via mapped memory with the following two sets
	 *   * position [-0.5,-0.5], size [1.0,1.0],
	 *   * position [-0.25,-0.25], size [1.5,1.5];
	 * - modify "atom_color" buffer via mapped memory to value 1;
	 * - execute MemoryBarrier for CLIENT_MAPPED_BUFFER_BARRIER_BIT;
	 * - enable blending with functions ONE for both source and destination;
	 * - execute DrawArrays for two vertices;
	 * - execute MemoryBarrier for ALL_BARRIER_BITS and Finish;
	 * - inspect contents of:
	 *   * texture - to verify that pixel at 8,8 is filled with RGBA8(3,0,0,0),
	 *   * "atom_color" - to verify that it is equal to 3;
	 * - modify "rectangles" buffer via mapped memory with the following two sets
	 *   * position [-1.0,-1.0], size [0.5,0.5],
	 *   * position [0.5,0.5], size [0.5,0.5];
	 * - modify "atom_color" buffer via mapped memory to value 5;
	 * - execute MemoryBarrier for CLIENT_MAPPED_BUFFER_BARRIER_BIT;
	 * - execute DrawArrays for two vertices;
	 * - execute MemoryBarrier for ALL_BARRIER_BITS and Finish;
	 * - inspect contents of:
	 *   * texture - to verify that pixel at 8,8 is filled with RGBA8(3,0,0,0),
	 *   * "atom_color" - to verify that it is equal to 7;
	 *
	 *  Additionally: change MemoryBarrier to FlushMapped*BufferRange if context supports OpenGL 4.5 Core Profile.
	 */
	{
		/* Choose specification */
		const bool is_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));

		/* Map buffers */
		atom.Bind();
		const Buffer::MapOwner atom_map(atom.MapRange(0 /* offset */, atom_data_size,
													  GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT |
														  (is_gl_45 ? GL_MAP_FLUSH_EXPLICIT_BIT : 0)));

		rectangles.Bind();
		const Buffer::MapOwner rectangles_map(
			rectangles.MapRange(0 /* offset */, rectangles_data_size,
								GL_MAP_PERSISTENT_BIT | GL_MAP_WRITE_BIT | (is_gl_45 ? GL_MAP_FLUSH_EXPLICIT_BIT : 0)));

		/* Clear binding points */
		Buffer::Bind(gl, 0, GL_ATOMIC_COUNTER_BUFFER);
		Buffer::Bind(gl, 0, GL_UNIFORM_BUFFER);

		/* Bind buffers */
		Buffer::BindBase(gl, atom.m_id, GL_ATOMIC_COUNTER_BUFFER, atom_binding);
		Buffer::BindBase(gl, rectangles.m_id, GL_UNIFORM_BUFFER, rectangles_binding);

		/* Set up blending */
		gl.enable(GL_BLEND);
		gl.blendFunc(GL_ONE, GL_ONE);

		/* Modify buffers */
		memcpy(atom_map.m_data, atom_first_data, atom_data_size);
		memcpy(rectangles_map.m_data, rectangles_first_data, rectangles_data_size);

		/* Execute barrier or flush content. */
		if (is_gl_45)
		{
			gl.flushMappedBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, atom_data_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFlushMappedBufferRange");

			gl.flushMappedBufferRange(GL_UNIFORM_BUFFER, 0, rectangles_data_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFlushMappedBufferRange");
		}
		else
		{
			gl.memoryBarrier(GL_CLIENT_MAPPED_BUFFER_BARRIER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");
		}

		/* Clear drawbuffer */
		GLint clear_color[4] = { 0, 0, 0, 0 };
		gl.clearBufferiv(GL_COLOR, 0, clear_color);

		/* Execute program for 2 vertices */
		gl.drawArrays(GL_POINTS, 0, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays with persistently mapped buffers");

		/* Execute barrier */
		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

		/* Inspect texture */
		Texture::GetData(gl, GL_TEXTURE_2D, GL_RGBA, GL_UNSIGNED_BYTE, texture_data);
		if (0 != memcmp(texture_data + pixel_offset, &expected_pixel, pixel_size))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Contents of framebuffer does not correspond with expected results"
												<< tcu::TestLog::EndMessage;
			tcu::ConstPixelBufferAccess img(
				tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), width, height,
				1 /* depth */, texture_data);
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Image("Framebuffer", "Framebuffer contents using initial buffer data", img);
		}

		/* Inspect atom */
		if (0 != memcmp(atom_map.m_data, &expected_atom_first, sizeof(GLuint)))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Contents of ATOMIC_COUNTER buffer are invalid."
												<< tcu::TestLog::EndMessage;
		}

		/* Modify buffers */
		memcpy(atom_map.m_data, atom_second_data, atom_data_size);
		memcpy(rectangles_map.m_data, rectangles_second_data, rectangles_data_size);

		/* Execute barrier or flush content. */
		if (is_gl_45)
		{
			gl.flushMappedBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, atom_data_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFlushMappedBufferRange");

			gl.flushMappedBufferRange(GL_UNIFORM_BUFFER, 0, rectangles_data_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFlushMappedBufferRange");
		}
		else
		{
			gl.memoryBarrier(GL_CLIENT_MAPPED_BUFFER_BARRIER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");
		}

		/* Execute program for 2 vertices */
		gl.drawArrays(GL_POINTS, 0, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays with persistently mapped buffers");

		/* Execute barrier */
		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

		/* Inspect texture */
		Texture::GetData(gl, GL_TEXTURE_2D, GL_RGBA, GL_UNSIGNED_BYTE, texture_data);
		if (0 != memcmp(texture_data + pixel_offset, &expected_pixel, pixel_size))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Contents of framebuffer does not correspond with expected results"
												<< tcu::TestLog::EndMessage;
			tcu::ConstPixelBufferAccess img(
				tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), width, height,
				1 /* depth */, texture_data);
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Image("Framebuffer", "Framebuffer contents using updated buffer data", img);
		}

		/* Inspect atom */
		if (0 != memcmp(atom_map.m_data, &expected_atom_second, sizeof(GLuint)))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Contents of ATOMIC_COUNTER buffer are invalid."
												<< tcu::TestLog::EndMessage;
		}
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}